

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edits.cpp
# Opt level: O0

Edits * __thiscall icu_63::Edits::copyArray(Edits *this,Edits *other)

{
  UBool UVar1;
  uint16_t *puVar2;
  uint16_t *newArray;
  Edits *other_local;
  Edits *this_local;
  
  UVar1 = ::U_FAILURE(this->errorCode_);
  if (UVar1 == '\0') {
    if (this->capacity < this->length) {
      puVar2 = (uint16_t *)uprv_malloc_63((long)this->length << 1);
      if (puVar2 == (uint16_t *)0x0) {
        this->numChanges = 0;
        this->delta = 0;
        this->length = 0;
        this->errorCode_ = U_MEMORY_ALLOCATION_ERROR;
        return this;
      }
      releaseArray(this);
      this->array = puVar2;
      this->capacity = this->length;
    }
    if (0 < this->length) {
      memcpy(this->array,other->array,(long)this->length << 1);
    }
  }
  else {
    this->numChanges = 0;
    this->delta = 0;
    this->length = 0;
  }
  return this;
}

Assistant:

Edits &Edits::copyArray(const Edits &other) {
    if (U_FAILURE(errorCode_)) {
        length = delta = numChanges = 0;
        return *this;
    }
    if (length > capacity) {
        uint16_t *newArray = (uint16_t *)uprv_malloc((size_t)length * 2);
        if (newArray == nullptr) {
            length = delta = numChanges = 0;
            errorCode_ = U_MEMORY_ALLOCATION_ERROR;
            return *this;
        }
        releaseArray();
        array = newArray;
        capacity = length;
    }
    if (length > 0) {
        uprv_memcpy(array, other.array, (size_t)length * 2);
    }
    return *this;
}